

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_> __thiscall
Parser::parseLambdaCall(Parser *this,bool lParenSkipped)

{
  _Variadic_union<double> _Var1;
  undefined1 auVar2 [8];
  _Variadic_union<double> _Var3;
  Mark *pMVar4;
  istream *piVar5;
  Token *pTVar6;
  _Variadic_union<double> _Var7;
  _Variadic_union<double> _Var8;
  int in_EDX;
  istream *piVar9;
  undefined7 in_register_00000031;
  Tokenizer *this_00;
  _Variadic_union<double> _Var10;
  list<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_> arguments
  ;
  _Variadic_union<double> local_a8;
  _Variadic_union<double> local_a0;
  _Variadic_union<double> local_98;
  undefined1 local_90 [8];
  _Variadic_union<double> local_88;
  undefined1 local_80 [40];
  Mark local_58;
  _Variadic_union<double> local_50;
  _Variadic_union<double> local_48;
  _Variadic_union<double> local_40;
  Mark local_38;
  
  this_00 = (Tokenizer *)CONCAT71(in_register_00000031,lParenSkipped);
  pMVar4 = Stream::getMark((Stream *)this_00);
  local_38 = *pMVar4;
  if (in_EDX == 0) {
    local_88 = (_Variadic_union<double>)(local_80 + 8);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)(local_90 + 8),"Expected open parenthesis!","");
    expectToken((Parser *)this_00,LParen,(string *)(local_90 + 8));
    if (local_88 != (_Variadic_union<double>)(local_80 + 8)) {
      operator_delete((void *)local_88,local_80._8_8_ + 1);
    }
  }
  parseLambda((Parser *)local_90);
  local_88 = (_Variadic_union<double>)(local_80 + 8);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(local_90 + 8),"Expected closing parenthesis!","");
  _Var1 = (_Variadic_union<double>)((long)local_90 + 8);
  expectToken((Parser *)this_00,RParen,(string *)_Var1);
  if (local_88 != (_Variadic_union<double>)(local_80 + 8)) {
    operator_delete((void *)local_88,local_80._8_8_ + 1);
  }
  parseCallArgumentList_abi_cxx11_
            ((list<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>
              *)&local_a8._M_first,(Parser *)this_00);
  piVar5 = (istream *)operator_new(0x30);
  auVar2 = local_90;
  _Var7 = local_98;
  local_90 = (undefined1  [8])0x0;
  local_80._8_8_ = local_98;
  local_88 = _Var1;
  local_80._0_8_ = _Var1;
  if (local_a8 != (_Variadic_union<double>)&local_a8) {
    *(_Variadic_union<double> *)local_a0 = _Var1;
    *(_Variadic_union<double> *)&((_Variadic_union<double> *)((long)local_a8 + 8))->_M_rest = _Var1;
    local_98 = (_Variadic_union<double>)0x0;
    local_88 = local_a8;
    local_80._0_8_ = local_a0;
    local_a8 = (_Variadic_union<double>)&local_a8;
    local_a0 = (_Variadic_union<double>)&local_a8;
  }
  *(undefined8 *)(piVar5 + 8) = 1;
  *(undefined ***)piVar5 = &PTR__LambdaCallNode_001ea148;
  *(undefined1 (*) [8])(piVar5 + 0x10) = auVar2;
  _Var8 = (_Variadic_union<double>)((long)piVar5 + 0x18);
  *(_Variadic_union<double> *)&((_Variadic_union<double> *)(piVar5 + 0x18))->_M_rest = local_88;
  *(undefined8 *)&((_Variadic_union<double> *)(piVar5 + 0x20))->_M_rest = local_80._0_8_;
  *(_Variadic_union<double> *)(piVar5 + 0x28) = _Var7;
  if (local_88 == _Var1) {
    *(_Variadic_union<double> *)(piVar5 + 0x20) = _Var8;
    *(_Variadic_union<double> *)(piVar5 + 0x18) = _Var8;
  }
  else {
    *(_Variadic_union<double> *)local_80._0_8_ = _Var8;
    *(_Variadic_union<double> *)((long)local_88 + 8) = _Var8;
    local_80._8_8_ = (_Variadic_union<double>)0x0;
    local_88 = _Var1;
    local_80._0_8_ = _Var1;
  }
  std::__cxx11::
  _List_base<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>::
  _M_clear((_List_base<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>
            *)(local_90 + 8));
  (this->tokenizer_).stream_.is_ = piVar5;
  pTVar6 = Tokenizer::peek(this_00);
  local_88._0_4_ = pTVar6->type;
  std::__detail::__variant::
  _Copy_ctor_base<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
  ::_Copy_ctor_base((_Copy_ctor_base<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                     *)local_80,
                    (_Copy_ctor_base<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                     *)&pTVar6->value);
  local_58 = pTVar6->mark;
  if (local_88._0_4_ == 0x29) {
    piVar9 = piVar5;
    do {
      parseCallArgumentList_abi_cxx11_
                ((list<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>
                  *)&local_50._M_first,(Parser *)this_00);
      std::__cxx11::
      list<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>::
      _M_move_assign((list<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>
                      *)&local_a8,&local_50);
      std::__cxx11::
      _List_base<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>
      ::_M_clear((_List_base<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>
                  *)&local_50._M_first);
      piVar5 = (istream *)operator_new(0x30);
      _Var1 = local_98;
      local_50 = (_Variadic_union<>)local_a8;
      local_48 = (_Variadic_union<>)local_a0;
      local_40 = local_98;
      _Var7 = (_Variadic_union<double>)&local_50;
      _Var8 = (_Variadic_union<double>)&local_50;
      _Var10 = (_Variadic_union<double>)&local_50;
      _Var3 = (_Variadic_union<double>)&local_50;
      if (local_a8 != (_Variadic_union<double>)&local_a8) {
        *(_Variadic_union<double> **)local_a0 = &local_50;
        *(_Variadic_union<double> **)&((_Variadic_union<double> *)((long)local_a8 + 8))->_M_rest =
             &local_50;
        local_98 = (_Variadic_union<double>)0x0;
        _Var7 = local_a8;
        _Var8 = local_a0;
        local_a8 = (_Variadic_union<double>)&local_a8;
        local_a0 = (_Variadic_union<double>)&local_a8;
        _Var10 = local_50;
        _Var3 = local_48;
      }
      local_48 = _Var3;
      local_50 = _Var10;
      *(undefined8 *)(piVar5 + 8) = 1;
      *(undefined ***)piVar5 = &PTR__FunctionResultCallNode_001e9ed8;
      *(istream **)(piVar5 + 0x10) = piVar9;
      _Var10 = (_Variadic_union<double>)((long)piVar5 + 0x18);
      *(_Variadic_union<double> *)&((_Variadic_union<double> *)(piVar5 + 0x18))->_M_rest = _Var7;
      *(_Variadic_union<double> *)&((_Variadic_union<double> *)(piVar5 + 0x20))->_M_rest = _Var8;
      *(_Variadic_union<double> *)(piVar5 + 0x28) = _Var1;
      if (_Var7 == (_Variadic_union<double>)&local_50) {
        *(_Variadic_union<double> *)(piVar5 + 0x20) = _Var10;
        *(_Variadic_union<double> *)(piVar5 + 0x18) = _Var10;
      }
      else {
        *(_Variadic_union<double> *)_Var8 = _Var10;
        *(_Variadic_union<double> *)((long)_Var7 + 8) = _Var10;
        local_40 = (_Variadic_union<double>)0x0;
        local_50 = (_Variadic_union<double>)&local_50;
        local_48 = (_Variadic_union<double>)&local_50;
      }
      std::__cxx11::
      _List_base<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>
      ::_M_clear((_List_base<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>
                  *)&local_50._M_first);
      pTVar6 = Tokenizer::peek(this_00);
      local_88._0_4_ = pTVar6->type;
      local_50 = (_Variadic_union<double>)local_80;
      (*std::__detail::__variant::
        __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:609:4)_&&,_const_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_&>
        ::_S_vtable._M_arr
        [*(__index_type *)
          ((long)&(pTVar6->value).
                  super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                  .super__Move_assign_alias<std::__cxx11::basic_string<char>,_double>.
                  super__Copy_assign_alias<std::__cxx11::basic_string<char>,_double>.
                  super__Move_ctor_alias<std::__cxx11::basic_string<char>,_double>.
                  super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_double>.
                  super__Variant_storage_alias<std::__cxx11::basic_string<char>,_double> + 0x20)].
        _M_data)((anon_class_8_1_8991fb9c_conflict *)&local_50,&pTVar6->value);
      local_58 = pTVar6->mark;
      piVar9 = piVar5;
    } while (local_88._0_4_ == 0x29);
    (this->tokenizer_).stream_.is_ = piVar5;
  }
  *(Mark *)(piVar5 + 8) = local_38;
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_&>
    ::_S_vtable._M_arr[(byte)local_80[0x20]]._M_data)
            ((anon_class_1_0_00000001 *)&local_50,
             (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
              *)local_80);
  std::__cxx11::
  _List_base<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>::
  _M_clear((_List_base<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>
            *)&local_a8._M_first);
  if (local_90 != (undefined1  [8])0x0) {
    (**(code **)(*(long *)local_90 + 8))();
  }
  return (__uniq_ptr_data<ExpressionNode,_std::default_delete<ExpressionNode>,_true,_true>)
         (__uniq_ptr_data<ExpressionNode,_std::default_delete<ExpressionNode>,_true,_true>)this;
}

Assistant:

std::unique_ptr<ExpressionNode> Parser::parseLambdaCall(bool lParenSkipped)
{
  const auto mark = tokenizer_.getMark();
  if(!lParenSkipped)
    expectToken(TokenType::LParen, "Expected open parenthesis!");
  
  auto lambda = parseLambda();
  expectToken(TokenType::RParen, "Expected closing parenthesis!");

  auto arguments = parseCallArgumentList();
  std::unique_ptr<ExpressionNode> node = std::make_unique<LambdaCallNode>(std::move(lambda), std::move(arguments));

  auto token = tokenizer_.peek();
  while(token.type == TokenType::LParen)
  {
    arguments = parseCallArgumentList();
    auto func = std::move(node);
    node = std::make_unique<FunctionResultCallNode>(std::move(func), std::move(arguments));
    token = tokenizer_.peek();
  }
  node->setMark(mark);
  return node;
}